

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetCurrentFont(ImFont *font)

{
  ImGuiContext *pIVar1;
  float local_20;
  bool local_19;
  ImGuiContext *g;
  ImFont *font_local;
  
  pIVar1 = GImGui;
  local_19 = false;
  if (font != (ImFont *)0x0) {
    local_19 = ImFont::IsLoaded(font);
  }
  if (local_19 == false) {
    __assert_fail("font && font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                  ,0x125f,"void SetCurrentFont(ImFont *)");
  }
  if (0.0 < font->Scale) {
    pIVar1->Font = font;
    pIVar1->FontBaseSize =
         (pIVar1->IO).FontGlobalScale * pIVar1->Font->FontSize * pIVar1->Font->Scale;
    if (pIVar1->CurrentWindow == (ImGuiWindow *)0x0) {
      local_20 = 0.0;
    }
    else {
      local_20 = ImGuiWindow::CalcFontSize(pIVar1->CurrentWindow);
    }
    pIVar1->FontSize = local_20;
    pIVar1->FontTexUvWhitePixel = pIVar1->Font->ContainerAtlas->TexUvWhitePixel;
    return;
  }
  __assert_fail("font->Scale > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                ,0x1260,"void SetCurrentFont(ImFont *)");
}

Assistant:

static void SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale;
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;
    g.FontTexUvWhitePixel = g.Font->ContainerAtlas->TexUvWhitePixel;
}